

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::Function::visitStatements<soul::heart::FunctionCall>
          (Function *this,function<void_(soul::heart::FunctionCall_&)> *fn)

{
  pointer ppVar1;
  FunctionCall *pFVar2;
  Statement *pSVar3;
  pointer ppVar4;
  
  ppVar4 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar4 == ppVar1) {
      return;
    }
    for (pSVar3 = (ppVar4->object->statements).firstObject; pSVar3 != (Statement *)0x0;
        pSVar3 = pSVar3->nextObject) {
      pFVar2 = (FunctionCall *)__dynamic_cast(pSVar3,&Statement::typeinfo,&FunctionCall::typeinfo,0)
      ;
      if (pFVar2 != (FunctionCall *)0x0) {
        if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*fn->_M_invoker)((_Any_data *)fn,pFVar2);
      }
    }
    ppVar4 = ppVar4 + 1;
  } while( true );
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn)
        {
            for (auto p : parameters)
                p->visitExpressions (fn, AccessType::read);

            for (auto s : statements)
                s->visitExpressions (fn);

            if (terminator != nullptr)
                terminator->visitExpressions (fn);
        }